

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readam.c
# Opt level: O2

DUH * dumb_read_riff_am(DUMBFILE *f,riff *stream)

{
  int *piVar1;
  riff_chunk *prVar2;
  riff *prVar3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  uchar uVar7;
  int iVar8;
  int32 iVar9;
  uint uVar10;
  int iVar11;
  DUMB_IT_SIGDATA *sigdata_00;
  riff *prVar12;
  IT_PATTERN *pIVar13;
  IT_SAMPLE *pIVar14;
  uchar *puVar15;
  DUH *pDVar16;
  uchar uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  DUH_SIGTYPE_DESC *descptr;
  sigdata_t *sigdata;
  char *tag [2] [2];
  
  descptr = &_dumb_sigtype_it;
  if ((stream != (riff *)0x0 && f != (DUMBFILE *)0x0) && (stream->type == 0x414d2020)) {
    sigdata_00 = (DUMB_IT_SIGDATA *)malloc(0x138);
    uVar21 = 0;
    if (sigdata_00 == (DUMB_IT_SIGDATA *)0x0) {
      return (DUH *)0x0;
    }
    sigdata_00->n_samples = 0;
    sigdata_00->n_patterns = 0;
    sigdata_00->name[0] = '\0';
    uVar20 = 0;
    while( true ) {
      uVar22 = (ulong)stream->chunk_count;
      if (uVar22 <= uVar20) break;
      prVar2 = stream->chunks;
      uVar10 = prVar2[uVar20].type;
      if (uVar10 == 0x52494646) {
        prVar3 = prVar2[uVar20].nested;
        if (prVar3->type == 0x41492020) {
          for (uVar22 = 0; uVar22 < prVar3->chunk_count; uVar22 = uVar22 + 1) {
            prVar2 = prVar3->chunks;
            if (prVar2[uVar22].type == 0x494e5354) {
              iVar8 = dumbfile_seek(f,(long)prVar2[uVar22].offset,0);
              if ((iVar8 != 0) || (uVar10 = dumbfile_igetl(f), uVar10 < 0x142)) goto LAB_0057e10f;
              dumbfile_skip(f,1);
              iVar8 = dumbfile_getc(f);
              if (sigdata_00->n_samples <= iVar8) {
                sigdata_00->n_samples = iVar8 + 1;
              }
              prVar12 = riff_parse(f,prVar2[uVar22].offset + uVar10 + 4,
                                   (prVar2[uVar22].size - uVar10) + -4,1);
              if (prVar12 != (riff *)0x0) {
                if (prVar12->type == 0x41532020) {
                  bVar5 = false;
                  for (lVar18 = 0; (ulong)prVar12->chunk_count * 0x18 - lVar18 != 0;
                      lVar18 = lVar18 + 0x18) {
                    bVar6 = bVar5;
                    if ((*(int *)((long)&prVar12->chunks->type + lVar18) == 0x53414d50) &&
                       (bVar6 = true, bVar5)) {
                      riff_free(prVar12);
                      goto LAB_0057e10f;
                    }
                    bVar5 = bVar6;
                  }
                }
                riff_free(prVar12);
              }
            }
          }
        }
      }
      else if (uVar10 == 0x4f524452) {
        if (((uVar21 & 2) != 0) || (prVar2[uVar20].size == 0)) goto LAB_0057e10f;
        uVar21 = uVar21 | 2;
      }
      else if (uVar10 == 0x50415454) {
        iVar8 = dumbfile_seek(f,(long)prVar2[uVar20].offset,0);
        if (iVar8 != 0) goto LAB_0057e10f;
        iVar8 = dumbfile_getc(f);
        if (sigdata_00->n_patterns <= iVar8) {
          sigdata_00->n_patterns = iVar8 + 1;
        }
        iVar9 = dumbfile_igetl(f);
        if (prVar2[uVar20].size < iVar9 + 5U) goto LAB_0057e10f;
      }
      else if (uVar10 == 0x494e4954) {
        if (((uVar21 & 1) != 0) || (prVar2[uVar20].size < 0x48)) goto LAB_0057e10f;
        uVar21 = uVar21 | 1;
      }
      uVar20 = uVar20 + 1;
    }
    if ((((uVar21 == 3) && (sigdata_00->n_samples != 0)) && (sigdata_00->n_patterns < 0x100)) &&
       ((sigdata_00->n_samples < 0x100 && (sigdata_00->n_patterns != 0)))) {
      sigdata_00->song_message = (uchar *)0x0;
      sigdata_00->n_orders = 0;
      sigdata_00->n_instruments = 0;
      sigdata_00->order = (uchar *)0x0;
      sigdata_00->instrument = (IT_INSTRUMENT *)0x0;
      sigdata_00->sample = (IT_SAMPLE *)0x0;
      sigdata_00->checkpoint = (IT_CHECKPOINT *)0x0;
      sigdata_00->pattern = (IT_PATTERN *)0x0;
      sigdata_00->midi = (IT_MIDI *)0x0;
      sigdata_00->mixing_volume = 0x30;
      sigdata_00->pan_separation = 0x80;
      sigdata_00->restart_position = '\0';
      builtin_memcpy(sigdata_00->channel_volume,
                     "@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@",0x40);
      cVar4 = (char)((dumb_it_default_panning_separation << 5) / 100);
      uVar17 = ' ' - cVar4;
      uVar7 = cVar4 + ' ';
      for (uVar20 = 0; uVar20 < 0x40; uVar20 = uVar20 + 4) {
        sigdata_00->channel_pan[uVar20] = uVar17;
        sigdata_00->channel_pan[uVar20 + 1] = uVar7;
        sigdata_00->channel_pan[uVar20 + 2] = uVar7;
        sigdata_00->channel_pan[uVar20 + 3] = uVar17;
      }
      for (uVar20 = 0; uVar20 < uVar22; uVar20 = uVar20 + 1) {
        prVar2 = stream->chunks;
        if (prVar2[uVar20].type == 0x494e4954) {
          iVar8 = dumbfile_seek(f,(long)prVar2[uVar20].offset,0);
          if (iVar8 != 0) goto LAB_0057e513;
          dumbfile_getnc((char *)sigdata_00,0x40,f);
          sigdata_00->name[0x40] = '\0';
          sigdata_00->flags = 0x131;
          uVar21 = dumbfile_getc(f);
          if ((uVar21 & 1) == 0) {
            *(byte *)&sigdata_00->flags = (byte)sigdata_00->flags | 8;
          }
          if ((uVar21 & 0xfffffffe) != 2) goto LAB_0057e513;
          iVar8 = dumbfile_getc(f);
          sigdata_00->n_pchannels = iVar8;
          iVar8 = dumbfile_getc(f);
          sigdata_00->speed = iVar8;
          iVar8 = dumbfile_getc(f);
          sigdata_00->tempo = iVar8;
          dumbfile_skip(f,4);
          iVar8 = dumbfile_getc(f);
          sigdata_00->global_volume = iVar8;
          iVar8 = sigdata_00->n_pchannels;
          if (prVar2[uVar20].size < iVar8 + 0x48U) goto LAB_0057e513;
          for (lVar18 = 0; lVar18 < iVar8; lVar18 = lVar18 + 1) {
            iVar8 = dumbfile_getc(f);
            uVar7 = (uchar)(iVar8 / 2);
            puVar15 = sigdata_00->channel_pan;
            if (0x80 < iVar8) {
              uVar7 = '\0';
              puVar15 = sigdata_00->channel_volume;
            }
            puVar15[lVar18] = uVar7;
            iVar8 = sigdata_00->n_pchannels;
          }
          uVar22 = (ulong)stream->chunk_count;
        }
      }
      uVar21 = sigdata_00->n_patterns;
      pIVar13 = (IT_PATTERN *)malloc((long)(int)uVar21 << 4);
      sigdata_00->pattern = pIVar13;
      if (pIVar13 != (IT_PATTERN *)0x0) {
        uVar22 = 0;
        uVar20 = (ulong)uVar21;
        if ((int)uVar21 < 1) {
          uVar20 = uVar22;
        }
        for (; uVar20 * 0x10 != uVar22; uVar22 = uVar22 + 0x10) {
          *(undefined8 *)((long)&pIVar13->entry + uVar22) = 0;
        }
        uVar20 = (ulong)sigdata_00->n_samples;
        pIVar14 = (IT_SAMPLE *)malloc(uVar20 * 0x68);
        sigdata_00->sample = pIVar14;
        if (pIVar14 != (IT_SAMPLE *)0x0) {
          lVar18 = 0;
          for (lVar19 = 0; lVar19 < (int)uVar20; lVar19 = lVar19 + 1) {
            pIVar14 = sigdata_00->sample;
            puVar15 = pIVar14->filename + lVar18 + 0x35;
            puVar15[0] = '\0';
            puVar15[1] = '\0';
            puVar15[2] = '\0';
            puVar15[3] = '\0';
            puVar15[4] = '\0';
            puVar15[5] = '\0';
            puVar15[6] = '\0';
            puVar15[7] = '\0';
            pIVar14->filename[lVar18 + 0xf] = '\0';
            pIVar14->name[lVar18] = '\0';
            uVar20 = (ulong)(uint)sigdata_00->n_samples;
            lVar18 = lVar18 + 0x68;
          }
          uVar20 = 0;
          do {
            if (stream->chunk_count <= uVar20) {
              _dumb_it_fix_invalid_orders(sigdata_00);
              tag[0][0] = "TITLE";
              tag[1][0] = "FORMAT";
              tag[1][1] = "RIFF AM";
              sigdata = sigdata_00;
              tag[0][1] = (char *)sigdata_00;
              pDVar16 = make_duh(-1,2,tag,1,&descptr,&sigdata);
              return pDVar16;
            }
            prVar2 = stream->chunks;
            uVar21 = prVar2[uVar20].type;
            if (uVar21 == 0x52494646) {
              prVar3 = prVar2[uVar20].nested;
              if (prVar3->type == 0x41492020) {
                for (uVar22 = 0; uVar22 < prVar3->chunk_count; uVar22 = uVar22 + 1) {
                  prVar2 = prVar3->chunks;
                  if (prVar2[uVar22].type == 0x494e5354) {
                    iVar8 = dumbfile_seek(f,(long)prVar2[uVar22].offset,0);
                    if (iVar8 != 0) goto LAB_0057e513;
                    iVar9 = dumbfile_igetl(f);
                    dumbfile_skip(f,1);
                    iVar8 = dumbfile_getc(f);
                    prVar12 = riff_parse(f,prVar2[uVar22].offset + iVar9 + 4,
                                         (prVar2[uVar22].size - iVar9) + -4,1);
                    pIVar14 = sigdata_00->sample;
                    if (prVar12 != (riff *)0x0) {
                      if (prVar12->type == 0x41532020) {
                        lVar18 = 0;
                        while ((ulong)prVar12->chunk_count * 0x18 + 0x18 != lVar18 + 0x18) {
                          piVar1 = (int *)((long)&prVar12->chunks->type + lVar18);
                          lVar18 = lVar18 + 0x18;
                          if (*piVar1 == 0x53414d50) {
                            riff_free(prVar12);
                            goto LAB_0057e513;
                          }
                        }
                      }
                      riff_free(prVar12);
                    }
                    dumbfile_seek(f,(long)prVar2[uVar22].offset + 6,0);
                    dumbfile_getnc((char *)(pIVar14 + iVar8),0x20,f);
                    pIVar14[iVar8].name[0x20] = '\0';
                  }
                }
              }
            }
            else if (uVar21 == 0x50415454) {
              iVar8 = dumbfile_seek(f,(long)prVar2[uVar20].offset,0);
              if (iVar8 != 0) break;
              iVar8 = dumbfile_getc(f);
              iVar9 = dumbfile_igetl(f);
              iVar8 = it_riff_am_process_pattern(sigdata_00->pattern + iVar8,f,iVar9,1);
              if (iVar8 != 0) break;
            }
            else if (uVar21 == 0x4f524452) {
              iVar8 = dumbfile_seek(f,(long)prVar2[uVar20].offset,0);
              if (iVar8 != 0) break;
              iVar11 = dumbfile_getc(f);
              iVar8 = iVar11 + 1;
              sigdata_00->n_orders = iVar8;
              if (prVar2[uVar20].size < iVar11 + 2U) break;
              puVar15 = (uchar *)malloc((long)iVar8);
              sigdata_00->order = puVar15;
              if (puVar15 == (uchar *)0x0) break;
              dumbfile_getnc((char *)puVar15,iVar8,f);
            }
            uVar20 = uVar20 + 1;
          } while( true );
        }
      }
LAB_0057e513:
      _dumb_it_unload_sigdata(sigdata_00);
    }
    else {
LAB_0057e10f:
      free(sigdata_00);
    }
  }
  return (DUH *)0x0;
}

Assistant:

DUH *dumb_read_riff_am( DUMBFILE * f, struct riff * stream )
{
	sigdata_t *sigdata;

	DUH_SIGTYPE_DESC *descptr = &_dumb_sigtype_it;

    sigdata = it_riff_am_load_sigdata( f, stream );

	if (!sigdata)
		return NULL;

	{
		const char *tag[2][2];
		tag[0][0] = "TITLE";
        tag[0][1] = (const char *)(((DUMB_IT_SIGDATA *)sigdata)->name);
		tag[1][0] = "FORMAT";
		tag[1][1] = "RIFF AM";
		return make_duh( -1, 2, ( const char * const (*) [ 2 ] ) tag, 1, & descptr, & sigdata );
	}
}